

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

Vec_Str_t * Scl_LibertyReadSclStr(Scl_Tree_t *p,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  void **ppvVar2;
  Scl_Item_t *pTiming;
  double dVar3;
  uint uVar4;
  __time_t vOut;
  Vec_Ptr_t *vOut_00;
  Vec_Flt_t *__ptr;
  Vec_Flt_t *__ptr_00;
  Vec_Flt_t *__ptr_01;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Vec_Ptr_t *vTemples;
  Vec_Str_t *vOut_01;
  char *pcVar10;
  Scl_Item_t *pSVar11;
  uint *__ptr_02;
  void *pvVar12;
  size_t sVar13;
  char *__dest;
  Scl_Item_t *pSVar14;
  Vec_Wrd_t *__ptr_03;
  Vec_Ptr_t *pVVar15;
  undefined8 *puVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Vec_Ptr_t *vTables [4];
  Vec_Flt_t *vValues;
  Vec_Flt_t *vInd1;
  Vec_Flt_t *vInd0;
  uint local_124;
  int local_104;
  timespec local_88;
  Vec_Ptr_t *local_78;
  Vec_Ptr_t *local_70;
  Vec_Ptr_t *local_60;
  char **local_58;
  ulong local_50;
  Vec_Flt_t *local_48;
  Vec_Flt_t *local_40;
  Vec_Flt_t *local_38;
  
  vTemples = Scl_LibertyReadTemplates(p);
  vOut_01 = (Vec_Str_t *)malloc(0x10);
  vOut_01->nCap = 10000;
  vOut_01->nSize = 0;
  pcVar10 = (char *)malloc(10000);
  vOut_01->pArray = pcVar10;
  vOut_01->nSize = 1;
  *pcVar10 = '\b';
  pcVar10 = Scl_LibertyReadString(p,p->pItems->Head);
  Vec_StrPutS_(vOut_01,pcVar10);
  pcVar10 = Scl_LibertyReadDefaultWireLoad(p);
  Vec_StrPutS_(vOut_01,pcVar10);
  pcVar10 = Scl_LibertyReadDefaultWireLoadSel(p);
  Vec_StrPutS_(vOut_01,pcVar10);
  fVar22 = Scl_LibertyReadDefaultMaxTrans(p);
  Vec_StrPutF_(vOut_01,fVar22);
  iVar5 = Scl_LibertyReadTimeUnit(p);
  Vec_StrPutI_(vOut_01,iVar5);
  Scl_LibertyReadLoadUnit(p,vOut_01);
  Scl_LibertyReadWireLoad(p,vOut_01);
  Scl_LibertyReadWireLoadSelect(p,vOut_01);
  pSVar11 = p->pItems;
  uVar1 = pSVar11->Child;
  if ((int)uVar1 < p->nItems) {
    local_124 = 0;
    iVar5 = 0;
    iVar8 = 0;
    local_104 = 0;
    if (pSVar11 != (Scl_Item_t *)0x0 && -1 < (int)uVar1) {
      pSVar11 = pSVar11 + uVar1;
      local_104 = 0;
      iVar8 = 0;
      iVar5 = 0;
      local_124 = 0;
      do {
        iVar7 = (pSVar11->Key).Beg;
        iVar6 = (pSVar11->Key).End - iVar7;
        iVar7 = strncmp(p->pContents + iVar7,"cell",(long)iVar6);
        if (iVar6 == 4 && iVar7 == 0) {
          iVar7 = Scl_LibertyReadCellIsFlop(p,pSVar11);
          if (iVar7 == 0) {
            iVar7 = Scl_LibertyReadCellIsDontUse(p,pSVar11);
            if (iVar7 == 0) {
              iVar7 = Scl_LibertyReadCellIsThreeState(p,pSVar11);
              if (iVar7 == 0) {
                iVar7 = Scl_LibertyReadCellOutputNum(p,pSVar11);
                if (iVar7 == 0) {
                  if (fVeryVerbose != 0) {
                    pcVar10 = Scl_LibertyReadString(p,pSVar11->Head);
                    printf("Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n",
                           pcVar10);
                  }
                  local_104 = local_104 + 1;
                }
                else {
                  local_124 = local_124 + 1;
                }
              }
              else {
                if (fVeryVerbose != 0) {
                  pcVar10 = Scl_LibertyReadString(p,pSVar11->Head);
                  printf("Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n",pcVar10);
                }
                iVar8 = iVar8 + 1;
              }
            }
            else if (fVeryVerbose != 0) {
              pcVar10 = Scl_LibertyReadString(p,pSVar11->Head);
              printf("Scl_LibertyReadGenlib() skipped cell \"%s\" due to dont_use attribute.\n",
                     pcVar10);
            }
          }
          else {
            if (fVeryVerbose != 0) {
              pcVar10 = Scl_LibertyReadString(p,pSVar11->Head);
              printf("Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n",pcVar10);
            }
            iVar5 = iVar5 + 1;
          }
        }
        uVar1 = pSVar11->Next;
        if (p->nItems <= (int)uVar1) goto LAB_00462f5a;
        if ((int)uVar1 < 0) {
          pSVar11 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar11 = p->pItems + uVar1;
        }
      } while (pSVar11 != (Scl_Item_t *)0x0);
    }
    Vec_StrPutI_(vOut_01,local_124);
    pSVar11 = p->pItems;
    uVar1 = pSVar11->Child;
    if ((int)uVar1 < p->nItems) {
      if (pSVar11 != (Scl_Item_t *)0x0 && -1 < (int)uVar1) {
        pSVar11 = pSVar11 + uVar1;
LAB_00462478:
        iVar7 = (pSVar11->Key).Beg;
        iVar6 = (pSVar11->Key).End - iVar7;
        iVar7 = strncmp(p->pContents + iVar7,"cell",(long)iVar6);
        if ((((iVar6 != 4 || iVar7 != 0) ||
             (iVar7 = Scl_LibertyReadCellIsFlop(p,pSVar11), iVar7 != 0)) ||
            (iVar7 = Scl_LibertyReadCellIsDontUse(p,pSVar11), iVar7 != 0)) ||
           ((iVar7 = Scl_LibertyReadCellIsThreeState(p,pSVar11), iVar7 != 0 ||
            (iVar7 = Scl_LibertyReadCellOutputNum(p,pSVar11), iVar7 == 0)))) goto LAB_004624d8;
        pcVar10 = Scl_LibertyReadString(p,pSVar11->Head);
        Vec_StrPutS_(vOut_01,pcVar10);
        pcVar10 = Scl_LibertyReadCellArea(p,pSVar11);
        fVar22 = 1.0;
        if (pcVar10 != (char *)0x0) {
          dVar3 = atof(pcVar10);
          fVar22 = (float)dVar3;
        }
        Vec_StrPutF_(vOut_01,fVar22);
        pcVar10 = Scl_LibertyReadCellLeakage(p,pSVar11);
        if (pcVar10 == (char *)0x0) {
          fVar22 = 0.0;
        }
        else {
          dVar3 = atof(pcVar10);
          fVar22 = (float)dVar3;
        }
        Vec_StrPutF_(vOut_01,fVar22);
        iVar7 = Scl_LibertyReadDeriveStrength(p,pSVar11);
        Vec_StrPutI_(vOut_01,iVar7);
        iVar7 = Scl_LibertyReadCellOutputNum(p,pSVar11);
        iVar6 = Scl_LibertyItemNum(p,pSVar11,"pin");
        Vec_StrPutI_(vOut_01,iVar6 - iVar7);
        Vec_StrPutI_(vOut_01,iVar7);
        __ptr_02 = (uint *)malloc(0x10);
        __ptr_02[0] = 0x10;
        __ptr_02[1] = 0;
        pvVar12 = malloc(0x80);
        *(void **)(__ptr_02 + 2) = pvVar12;
        uVar1 = pSVar11->Child;
        if ((int)uVar1 < p->nItems) {
          if (-1 < (int)uVar1) goto LAB_00462edd;
LAB_0046260f:
          pSVar14 = (Scl_Item_t *)0x0;
          do {
            if (pSVar14 == (Scl_Item_t *)0x0) {
              uVar1 = pSVar11->Child;
              goto LAB_004626ec;
            }
            iVar7 = (pSVar14->Key).Beg;
            iVar6 = (pSVar14->Key).End - iVar7;
            iVar7 = strncmp(p->pContents + iVar7,"pin",(long)iVar6);
            if ((iVar6 == 3 && iVar7 == 0) &&
               (pcVar10 = Scl_LibertyReadPinFormula(p,pSVar14), pcVar10 == (char *)0x0)) {
              iVar7 = Scl_LibertyReadPinDirection(p,pSVar14);
              if (iVar7 != 0) {
                __assert_fail("Scl_LibertyReadPinDirection(p, pPin) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                              ,0x5f8,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
              }
              pcVar10 = Scl_LibertyReadString(p,pSVar14->Head);
              if (pcVar10 == (char *)0x0) {
                __dest = (char *)0x0;
              }
              else {
                sVar13 = strlen(pcVar10);
                __dest = (char *)malloc(sVar13 + 1);
                strcpy(__dest,pcVar10);
              }
              uVar1 = __ptr_02[1];
              uVar9 = *__ptr_02;
              if (uVar1 == uVar9) {
                if ((int)uVar9 < 0x10) {
                  if (*(void **)(__ptr_02 + 2) == (void *)0x0) {
                    pvVar12 = malloc(0x80);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(__ptr_02 + 2),0x80);
                  }
                  uVar17 = 0x10;
                }
                else {
                  uVar17 = uVar9 * 2;
                  if ((int)uVar17 <= (int)uVar9) goto LAB_00462e08;
                  if (*(void **)(__ptr_02 + 2) == (void *)0x0) {
                    pvVar12 = malloc((ulong)uVar9 << 4);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(__ptr_02 + 2),(ulong)uVar9 << 4);
                  }
                }
                *(void **)(__ptr_02 + 2) = pvVar12;
                *__ptr_02 = uVar17;
              }
LAB_00462e08:
              __ptr_02[1] = uVar1 + 1;
              *(char **)(*(long *)(__ptr_02 + 2) + (long)(int)uVar1 * 8) = __dest;
              Vec_StrPutS_(vOut_01,pcVar10);
              fVar22 = Scl_LibertyReadPinCap(p,pSVar14,"capacitance");
              fVar23 = Scl_LibertyReadPinCap(p,pSVar14,"rise_capacitance");
              fVar24 = Scl_LibertyReadPinCap(p,pSVar14,"fall_capacitance");
              Vec_StrPutF_(vOut_01,(float)(~-(uint)(fVar23 == 0.0) & (uint)fVar23 |
                                          -(uint)(fVar23 == 0.0) & (uint)fVar22));
              Vec_StrPutF_(vOut_01,(float)(~-(uint)(fVar24 == 0.0) & (uint)fVar24 |
                                          (uint)fVar22 & -(uint)(fVar24 == 0.0)));
            }
            uVar1 = pSVar14->Next;
            if (p->nItems <= (int)uVar1) break;
            if ((int)uVar1 < 0) goto LAB_0046260f;
LAB_00462edd:
            pSVar14 = p->pItems + uVar1;
          } while( true );
        }
        goto LAB_00462f5a;
      }
LAB_0046231d:
      if (vTemples != (Vec_Ptr_t *)0x0) {
        uVar1 = vTemples->nSize;
        if ((uVar1 & 3) != 0) {
          __assert_fail("Vec_PtrSize(vTemples) % 4 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                        ,0x676,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
        }
        if (0 < (int)uVar1) {
          ppvVar2 = vTemples->pArray;
          uVar19 = 0;
          do {
            pvVar12 = ppvVar2[uVar19];
            if (pvVar12 != (void *)0x0) {
              if (((uint)uVar19 & 3) - 2 < 2) {
                if (*(void **)((long)pvVar12 + 8) != (void *)0x0) {
                  free(*(void **)((long)pvVar12 + 8));
                  *(undefined8 *)((long)pvVar12 + 8) = 0;
                }
              }
              else if ((uVar19 & 3) != 0) goto LAB_00462385;
              free(pvVar12);
            }
LAB_00462385:
            uVar19 = uVar19 + 1;
          } while (uVar1 != uVar19);
        }
        if (vTemples->pArray != (void **)0x0) {
          free(vTemples->pArray);
          vTemples->pArray = (void **)0x0;
        }
        free(vTemples);
      }
      if (fVerbose != 0) {
        pcVar10 = Scl_LibertyReadString(p,p->pItems->Head);
        printf("Library \"%s\" from \"%s\" has %d cells ",pcVar10,p->pFileName,(ulong)local_124);
        printf("(%d skipped: %d seq; %d tri-state; %d no func; %d dont_use).  ",
               (ulong)(uint)(iVar8 + iVar5 + local_104));
        iVar5 = clock_gettime(3,&local_88);
        if (iVar5 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
        }
        lVar20 = p->clkStart;
        Abc_Print(1,"%s =","Time");
        Abc_Print(1,"%9.2f sec\n",SUB84((double)(lVar18 - lVar20) / 1000000.0,0));
      }
      return vOut_01;
    }
  }
LAB_00462f5a:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
LAB_004626ec:
  if (p->nItems <= (int)uVar1) goto LAB_00462f5a;
  if ((int)uVar1 < 0) {
    pSVar14 = (Scl_Item_t *)0x0;
  }
  else {
    pSVar14 = p->pItems + uVar1;
  }
  if (pSVar14 == (Scl_Item_t *)0x0) goto LAB_00462d84;
  iVar7 = (pSVar14->Key).Beg;
  iVar6 = (pSVar14->Key).End - iVar7;
  iVar7 = strncmp(p->pContents + iVar7,"pin",(long)iVar6);
  if ((iVar6 == 3 && iVar7 == 0) &&
     (pcVar10 = Scl_LibertyReadPinFormula(p,pSVar14), pcVar10 != (char *)0x0)) {
    iVar7 = Scl_LibertyReadPinDirection(p,pSVar14);
    if (iVar7 != 1) {
      __assert_fail("Scl_LibertyReadPinDirection(p, pPin) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                    ,0x60d,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
    }
    pcVar10 = Scl_LibertyReadString(p,pSVar14->Head);
    Vec_StrPutS_(vOut_01,pcVar10);
    fVar22 = Scl_LibertyReadPinCap(p,pSVar14,"max_capacitance");
    Vec_StrPutF_(vOut_01,fVar22);
    fVar22 = Scl_LibertyReadPinCap(p,pSVar14,"max_transition");
    Vec_StrPutF_(vOut_01,fVar22);
    uVar1 = __ptr_02[1];
    Vec_StrPutI_(vOut_01,uVar1);
    pcVar10 = Scl_LibertyReadPinFormula(p,pSVar14);
    Vec_StrPutS_(vOut_01,pcVar10);
    local_58 = *(char ***)(__ptr_02 + 2);
    __ptr_03 = Mio_ParseFormulaTruth(pcVar10,local_58,uVar1);
    if (__ptr_03 == (Vec_Wrd_t *)0x0) {
      return (Vec_Str_t *)0x0;
    }
    uVar9 = 1 << ((char)uVar1 - 6U & 0x1f);
    if ((int)uVar1 < 7) {
      uVar9 = 1;
    }
    if (0 < (int)uVar9) {
      uVar19 = 0;
      do {
        if ((long)__ptr_03->nSize <= (long)uVar19) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        uVar21 = __ptr_03->pArray[uVar19];
        lVar20 = (long)vOut_01->nSize;
        uVar17 = vOut_01->nCap;
        pcVar10 = vOut_01->pArray;
        lVar18 = 0;
        do {
          if ((uint)lVar20 == uVar17) {
            if ((int)uVar17 < 0x10) {
              if (pcVar10 == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(pcVar10,0x10);
              }
              uVar17 = 0x10;
            }
            else {
              uVar4 = uVar17 * 2;
              if (SBORROW4(uVar17,uVar4) != 0 < (int)uVar17) {
                uVar17 = uVar4;
                if (pcVar10 == (char *)0x0) {
                  pcVar10 = (char *)malloc((ulong)uVar4);
                }
                else {
                  pcVar10 = (char *)realloc(pcVar10,(ulong)uVar4);
                }
              }
            }
          }
          pcVar10[lVar20] = (char)(uVar21 >> ((byte)lVar18 & 0x3f));
          lVar20 = lVar20 + 1;
          lVar18 = lVar18 + 8;
        } while (lVar18 != 0x40);
        vOut_01->nSize = (int)lVar20;
        vOut_01->nCap = uVar17;
        vOut_01->pArray = pcVar10;
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar9);
    }
    if (__ptr_03->pArray != (word *)0x0) {
      free(__ptr_03->pArray);
      __ptr_03->pArray = (word *)0x0;
    }
    free(__ptr_03);
    if (0 < (int)uVar1) {
      uVar19 = 0;
      do {
        pcVar10 = local_58[uVar19];
        pVVar15 = Scl_LibertyReadPinTimingAll(p,pSVar14,pcVar10);
        Vec_StrPutS_(vOut_01,pcVar10);
        uVar9 = pVVar15->nSize;
        uVar21 = (ulong)uVar9;
        Vec_StrPutI_(vOut_01,(uint)(uVar21 != 0));
        if (uVar21 == 0) {
          if (pVVar15->pArray != (void **)0x0) {
            free(pVVar15->pArray);
            pVVar15->pArray = (void **)0x0;
          }
          iVar7 = 0x16;
          if (pVVar15 != (Vec_Ptr_t *)0x0) {
            free(pVVar15);
          }
        }
        else {
          local_50 = uVar21;
          if ((int)uVar9 < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar2 = pVVar15->pArray;
          local_60 = pVVar15;
          iVar7 = Scl_LibertyReadTimingSense(p,(Scl_Item_t *)*ppvVar2);
          Vec_StrPutI_(vOut_01,iVar7);
          lVar18 = 0;
          do {
            puVar16 = (undefined8 *)malloc(0x10);
            *puVar16 = 0x10;
            pvVar12 = malloc(0x80);
            puVar16[1] = pvVar12;
            (&local_88.tv_sec)[lVar18] = (__time_t)puVar16;
            vOut_00 = local_70;
            pVVar15 = local_78;
            lVar20 = local_88.tv_nsec;
            vOut = local_88.tv_sec;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          uVar21 = 0;
          do {
            pTiming = (Scl_Item_t *)ppvVar2[uVar21];
            iVar7 = Scl_LibertyScanTable(p,(Vec_Ptr_t *)vOut,pTiming,"cell_rise",vTemples);
            if ((((iVar7 == 0) &&
                 (iVar7 = Scl_LibertyScanTable(p,(Vec_Ptr_t *)vOut,pTiming,"cell_fall",vTemples),
                 iVar7 == 0)) ||
                ((iVar7 = Scl_LibertyScanTable(p,(Vec_Ptr_t *)lVar20,pTiming,"cell_fall",vTemples),
                 iVar7 == 0 &&
                 (iVar7 = Scl_LibertyScanTable(p,(Vec_Ptr_t *)lVar20,pTiming,"cell_rise",vTemples),
                 iVar7 == 0)))) ||
               ((iVar7 = Scl_LibertyScanTable(p,pVVar15,pTiming,"rise_transition",vTemples),
                iVar7 == 0 &&
                (iVar7 = Scl_LibertyScanTable(p,pVVar15,pTiming,"fall_transition",vTemples),
                iVar7 == 0)))) {
              puts("Table cannot be found");
LAB_00462d1e:
              iVar7 = 1;
              goto LAB_00462d2a;
            }
            iVar7 = Scl_LibertyScanTable(p,vOut_00,pTiming,"fall_transition",vTemples);
            if ((iVar7 == 0) &&
               (iVar7 = Scl_LibertyScanTable(p,vOut_00,pTiming,"rise_transition",vTemples),
               iVar7 == 0)) {
              puts("Table cannot be found");
              goto LAB_00462d1e;
            }
            uVar21 = uVar21 + 1;
          } while (local_50 != uVar21);
          free(ppvVar2);
          local_60->pArray = (void **)0x0;
          if (local_60 != (Vec_Ptr_t *)0x0) {
            free(local_60);
          }
          lVar18 = 0;
          do {
            pVVar15 = (Vec_Ptr_t *)(&local_88.tv_sec)[lVar18];
            Scl_LibertyComputeWorstCase(pVVar15,&local_38,&local_40,&local_48);
            if (0 < pVVar15->nSize) {
              lVar20 = 0;
              do {
                pvVar12 = pVVar15->pArray[lVar20];
                if (pvVar12 != (void *)0x0) {
                  if (*(void **)((long)pvVar12 + 8) != (void *)0x0) {
                    free(*(void **)((long)pvVar12 + 8));
                    *(undefined8 *)((long)pvVar12 + 8) = 0;
                  }
                  free(pvVar12);
                }
                lVar20 = lVar20 + 1;
              } while (lVar20 < pVVar15->nSize);
            }
            if (pVVar15->pArray != (void **)0x0) {
              free(pVVar15->pArray);
              pVVar15->pArray = (void **)0x0;
            }
            if (pVVar15 != (Vec_Ptr_t *)0x0) {
              free(pVVar15);
            }
            __ptr_01 = local_38;
            __ptr_00 = local_40;
            __ptr = local_48;
            Scl_LibertyDumpTables(vOut_01,local_38,local_40,local_48);
            if (__ptr_01->pArray != (float *)0x0) {
              free(__ptr_01->pArray);
              __ptr_01->pArray = (float *)0x0;
            }
            if (__ptr_01 != (Vec_Flt_t *)0x0) {
              free(__ptr_01);
            }
            if (__ptr_00->pArray != (float *)0x0) {
              free(__ptr_00->pArray);
              __ptr_00->pArray = (float *)0x0;
            }
            if (__ptr_00 != (Vec_Flt_t *)0x0) {
              free(__ptr_00);
            }
            if (__ptr->pArray != (float *)0x0) {
              free(__ptr->pArray);
              __ptr->pArray = (float *)0x0;
            }
            if (__ptr != (Vec_Flt_t *)0x0) {
              free(__ptr);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          iVar7 = 0;
        }
LAB_00462d2a:
        if ((iVar7 != 0x16) && (iVar7 != 0)) {
          return (Vec_Str_t *)0x0;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar1);
    }
  }
  uVar1 = pSVar14->Next;
  goto LAB_004626ec;
LAB_00462d84:
  uVar1 = __ptr_02[1];
  if (0 < (long)(int)uVar1) {
    lVar18 = *(long *)(__ptr_02 + 2);
    lVar20 = 0;
    do {
      pvVar12 = *(void **)(lVar18 + lVar20 * 8);
      if ((void *)0x2 < pvVar12) {
        free(pvVar12);
      }
      lVar20 = lVar20 + 1;
    } while ((int)uVar1 != lVar20);
  }
  if (*(void **)(__ptr_02 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_02 + 2));
    __ptr_02[2] = 0;
    __ptr_02[3] = 0;
  }
  free(__ptr_02);
LAB_004624d8:
  uVar1 = pSVar11->Next;
  if (p->nItems <= (int)uVar1) goto LAB_00462f5a;
  if ((int)uVar1 < 0) {
    pSVar11 = (Scl_Item_t *)0x0;
  }
  else {
    pSVar11 = p->pItems + uVar1;
  }
  if (pSVar11 == (Scl_Item_t *)0x0) goto LAB_0046231d;
  goto LAB_00462478;
}

Assistant:

Vec_Str_t * Scl_LibertyReadSclStr( Scl_Tree_t * p, int fVerbose, int fVeryVerbose )
{
    int fUseFirstTable = 0;
    Vec_Str_t * vOut;
    Vec_Ptr_t * vNameIns, * vTemples = NULL;
    Scl_Item_t * pCell, * pPin, * pTiming;
    Vec_Wrd_t * vTruth;
    char * pFormula, * pName;
    int i, k, Counter, nOutputs, nCells;
    int nSkipped[4] = {0};

    // read delay-table templates
    vTemples = Scl_LibertyReadTemplates( p );

    // start the library
    vOut = Vec_StrAlloc( 10000 );
    Vec_StrPutI_( vOut, ABC_SCL_CUR_VERSION );

    // top level information
    Vec_StrPut_( vOut );
    Vec_StrPutS_( vOut, Scl_LibertyReadString(p, Scl_LibertyRoot(p)->Head) );
    Vec_StrPutS_( vOut, Scl_LibertyReadDefaultWireLoad(p) );
    Vec_StrPutS_( vOut, Scl_LibertyReadDefaultWireLoadSel(p) );
    Vec_StrPutF_( vOut, Scl_LibertyReadDefaultMaxTrans(p) );
    Vec_StrPutI_( vOut, Scl_LibertyReadTimeUnit(p) );
    Scl_LibertyReadLoadUnit( p, vOut );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );

    // read wire loads
    Scl_LibertyReadWireLoad( p, vOut );
    Scl_LibertyReadWireLoadSelect( p, vOut );

    // count cells
    nCells = 0;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[0]++;
            continue;
        }
        if ( Scl_LibertyReadCellIsDontUse(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" due to dont_use attribute.\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[3]++;
            continue;
        }
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[1]++;
            continue;
        }
        if ( (Counter = Scl_LibertyReadCellOutputNum(p, pCell)) == 0 )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[2]++;
            continue;
        }
        nCells++;
    }
    // read cells
    Vec_StrPutI_( vOut, nCells );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
            continue;
        if ( Scl_LibertyReadCellIsDontUse(p, pCell) )
            continue;
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
            continue;
        if ( (Counter = Scl_LibertyReadCellOutputNum(p, pCell)) == 0 )
            continue;
        // top level information
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pCell->Head) );
        pName = Scl_LibertyReadCellArea(p, pCell);
        Vec_StrPutF_( vOut, pName ? atof(pName) : 1 );
        pName = Scl_LibertyReadCellLeakage(p, pCell);
        Vec_StrPutF_( vOut, pName ? atof(pName) : 0 );
        Vec_StrPutI_( vOut, Scl_LibertyReadDeriveStrength(p, pCell) );
        // pin count
        nOutputs = Scl_LibertyReadCellOutputNum( p, pCell );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pCell, "pin") - nOutputs );
        Vec_StrPutI_( vOut, nOutputs );
        Vec_StrPut_( vOut );
        Vec_StrPut_( vOut );

        // input pins
        vNameIns = Vec_PtrAlloc( 16 );
        Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        {
            float CapOne, CapRise, CapFall;
            if ( Scl_LibertyReadPinFormula(p, pPin) != NULL ) // skip output pin
                continue;
            assert( Scl_LibertyReadPinDirection(p, pPin) == 0 );
            pName = Scl_LibertyReadString(p, pPin->Head);
            Vec_PtrPush( vNameIns, Abc_UtilStrsav(pName) );
            Vec_StrPutS_( vOut, pName );
            CapOne  = Scl_LibertyReadPinCap( p, pPin, "capacitance" );
            CapRise = Scl_LibertyReadPinCap( p, pPin, "rise_capacitance" );
            CapFall = Scl_LibertyReadPinCap( p, pPin, "fall_capacitance" );
            if ( CapRise == 0 )
                CapRise = CapOne;
            if ( CapFall == 0 )
                CapFall = CapOne;
            Vec_StrPutF_( vOut, CapRise );
            Vec_StrPutF_( vOut, CapFall );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
        // output pins
        Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        {
            if ( !Scl_LibertyReadPinFormula(p, pPin) ) // skip input pin
                continue;
            assert( Scl_LibertyReadPinDirection(p, pPin) == 1 );
            pName = Scl_LibertyReadString(p, pPin->Head);
            Vec_StrPutS_( vOut, pName );
            Vec_StrPutF_( vOut, Scl_LibertyReadPinCap( p, pPin, "max_capacitance" ) );
            Vec_StrPutF_( vOut, Scl_LibertyReadPinCap( p, pPin, "max_transition" ) );
            Vec_StrPutI_( vOut, Vec_PtrSize(vNameIns) );
            pFormula = Scl_LibertyReadPinFormula(p, pPin);
            Vec_StrPutS_( vOut, pFormula );
            // write truth table
            vTruth = Mio_ParseFormulaTruth( pFormula, (char **)Vec_PtrArray(vNameIns), Vec_PtrSize(vNameIns) );
            if ( vTruth == NULL )
                return NULL;
            for ( i = 0; i < Abc_Truth6WordNum(Vec_PtrSize(vNameIns)); i++ )
                Vec_StrPutW_( vOut, Vec_WrdEntry(vTruth, i) );
            Vec_WrdFree( vTruth );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );

            // write the delay tables
            if ( fUseFirstTable )
            {
                Vec_PtrForEachEntry( char *, vNameIns, pName, i )
                {
                    pTiming = Scl_LibertyReadPinTiming( p, pPin, pName );
                    Vec_StrPutS_( vOut, pName );
                    Vec_StrPutI_( vOut, (int)(pTiming != NULL) );
                    if ( pTiming == NULL ) // output does not depend on input
                        continue;
                    Vec_StrPutI_( vOut, Scl_LibertyReadTimingSense(p, pTiming) );
                    Vec_StrPut_( vOut );
                    Vec_StrPut_( vOut );
                    // some cells only have 'rise' or 'fall' but not both - here we work around this
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_rise",           vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_fall",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_fall",           vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_rise",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "rise_transition",     vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "fall_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "fall_transition",     vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "rise_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }  
                }
                continue;
            }

            // write the timing tables
            Vec_PtrForEachEntry( char *, vNameIns, pName, i )
            {
                Vec_Ptr_t * vTables[4];
                Vec_Ptr_t * vTimings;
                vTimings = Scl_LibertyReadPinTimingAll( p, pPin, pName );
                Vec_StrPutS_( vOut, pName );
                Vec_StrPutI_( vOut, (int)(Vec_PtrSize(vTimings) != 0) );
                if ( Vec_PtrSize(vTimings) == 0 ) // output does not depend on input
                {
                    Vec_PtrFree( vTimings );
                    continue;
                }
                Vec_StrPutI_( vOut, Scl_LibertyReadTimingSense(p, (Scl_Item_t *)Vec_PtrEntry(vTimings, 0)) );
                Vec_StrPut_( vOut );
                Vec_StrPut_( vOut );
                // collect the timing tables
                for ( k = 0; k < 4; k++ )
                    vTables[k] = Vec_PtrAlloc( 16 );
                Vec_PtrForEachEntry( Scl_Item_t *, vTimings, pTiming, k )
                {
                    // some cells only have 'rise' or 'fall' but not both - here we work around this
                    if ( !Scl_LibertyScanTable( p, vTables[0], pTiming, "cell_rise",           vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[0], pTiming, "cell_fall",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[1], pTiming, "cell_fall",           vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[1], pTiming, "cell_rise",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[2], pTiming, "rise_transition",     vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[2], pTiming, "fall_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[3], pTiming, "fall_transition",     vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[3], pTiming, "rise_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }  
                }
                Vec_PtrFree( vTimings );
                // compute worse case of the tables
                for ( k = 0; k < 4; k++ )
                {
                    Vec_Flt_t * vInd0, * vInd1, * vValues;
                    if ( !Scl_LibertyComputeWorstCase( vTables[k], &vInd0, &vInd1, &vValues ) )
                        { printf( "Table indexes have different values\n" ); return NULL; }  
                    Vec_VecFree( (Vec_Vec_t *)vTables[k] );
                    Scl_LibertyDumpTables( vOut, vInd0, vInd1, vValues );
                    Vec_FltFree( vInd0 );
                    Vec_FltFree( vInd1 );
                    Vec_FltFree( vValues );
                }
            }
        }
        Vec_StrPut_( vOut );
        Vec_PtrFreeFree( vNameIns );
    }
    // free templates
    if ( vTemples )
    {
        Vec_Flt_t * vArray;
        assert( Vec_PtrSize(vTemples) % 4 == 0 );
        Vec_PtrForEachEntry( Vec_Flt_t *, vTemples, vArray, i )
        {
            if ( vArray == NULL )
                continue;
            if ( i % 4 == 0 )
                ABC_FREE( vArray );
            else if ( i % 4 == 2 || i % 4 == 3 )
                Vec_FltFree( vArray );
        }
        Vec_PtrFree( vTemples );
    }
    if ( fVerbose )
    {
        printf( "Library \"%s\" from \"%s\" has %d cells ", 
            Scl_LibertyReadString(p, Scl_LibertyRoot(p)->Head), p->pFileName, nCells );
        printf( "(%d skipped: %d seq; %d tri-state; %d no func; %d dont_use).  ", 
            nSkipped[0]+nSkipped[1]+nSkipped[2], nSkipped[0], nSkipped[1], nSkipped[2], nSkipped[3] );
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    return vOut;
}